

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::ForwardPass(GlobOpt *this)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  JITTimeFunctionBody *this_00;
  uint *puVar6;
  SparseArray<Value> *pSVar7;
  JitArenaAllocator *pJVar8;
  BVSparse<Memory::JitArenaAllocator> *pBVar9;
  undefined4 *puVar10;
  BasicBlock *local_3f0;
  BasicBlock *block_1;
  uint spilledCount;
  uint freedCount;
  BasicBlock *block;
  BasicBlock *blockNext;
  BVSparse<Memory::JitArenaAllocator> localFinishedStackLiteralInitFld;
  ValueNumberPairToValueMap localValuesCreatedForMerge;
  ValueSetByValueNumber localValuesCreatedForClone;
  SymIdToInstrMap localPrePassInstrMap;
  StringConstantToValueMap localStringConstantToValueMap;
  AddrConstantToValueMap localAddrConstantToValueMap;
  Int64ConstantToValueMap localInt64ConstantToValueMap;
  IntConstantToValueMap localIntConstantToValueMap;
  IntConstantToStackSymMap localIntConstantToStackSymMap;
  OpndList localNoImplicitCallUsesToInsert;
  TrackAllocData local_1b0;
  code *local_188;
  undefined8 local_180;
  TrackAllocData local_178;
  code *local_150;
  undefined8 local_148;
  TrackAllocData local_140;
  code *local_118;
  undefined8 local_110;
  TrackAllocData local_108;
  code *local_e0;
  undefined8 local_d8;
  TrackAllocData local_d0;
  code *local_a8;
  undefined8 local_a0;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  uint local_34;
  RegSlot local_30 [4];
  undefined1 local_20 [8];
  AutoCodeGenPhase __autoCodeGen;
  GlobOpt *this_local;
  
  __autoCodeGen._8_8_ = this;
  AutoCodeGenPhase::AutoCodeGenPhase((AutoCodeGenPhase *)local_20,this->func,ForwardPhase);
  uVar4 = Func::GetSourceContextId(this->func);
  uVar5 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar4,uVar5);
  if (bVar3) {
    Func::DumpHeader(this->func);
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,GlobOptPhase);
  if (bVar3) {
    TraceSettings(this);
  }
  pJVar8 = this->alloc;
  this_00 = Func::GetJITFunctionBody(this->func);
  local_30[0] = JITTimeFunctionBody::GetConstCount(this_00);
  local_34 = 0x40;
  puVar6 = max<unsigned_int>(local_30,&local_34);
  pSVar7 = SparseArray<Value>::New(&pJVar8->super_ArenaAllocator,*puVar6);
  this->byteCodeConstantValueArray = pSVar7;
  pJVar8 = this->alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
             ,0x162);
  pJVar8 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar8,&local_60);
  local_70 = Memory::JitArenaAllocator::Alloc;
  local_68 = 0;
  pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar8,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar9,this->alloc);
  this->byteCodeConstantValueNumbersBv = pBVar9;
  pJVar8 = this->alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_98,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
             ,0x163);
  pJVar8 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar8,&local_98);
  local_a8 = Memory::JitArenaAllocator::Alloc;
  local_a0 = 0;
  pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar8,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar9,this->alloc);
  this->tempBv = pBVar9;
  pJVar8 = this->alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_d0,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
             ,0x164);
  pJVar8 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar8,&local_d0);
  local_e0 = Memory::JitArenaAllocator::Alloc;
  local_d8 = 0;
  pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar8,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar9,this->alloc);
  this->prePassCopyPropSym = pBVar9;
  pJVar8 = this->alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_108,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
             ,0x165);
  pJVar8 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar8,&local_108);
  local_118 = Memory::JitArenaAllocator::Alloc;
  local_110 = 0;
  pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar8,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar9,this->alloc);
  this->slotSyms = pBVar9;
  this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->propertySymUse = (PropertySym *)0x0;
  pJVar8 = this->alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_140,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
             ,0x16a);
  pJVar8 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar8,&local_140);
  local_150 = Memory::JitArenaAllocator::Alloc;
  local_148 = 0;
  pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar8,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar9,this->alloc);
  this->changedSymsAfterIncBailoutCandidate = pBVar9;
  pJVar8 = this->alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_178,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
             ,0x16c);
  pJVar8 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar8,&local_178);
  local_188 = Memory::JitArenaAllocator::Alloc;
  local_180 = 0;
  pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar8,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar9,this->alloc);
  this->auxSlotPtrSyms = pBVar9;
  pJVar8 = this->alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_1b0,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
             ,0x16f);
  pJVar8 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar8,&local_1b0);
  pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,pJVar8,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar9,this->alloc);
  this->byteCodeUsesBeforeOpt = pBVar9;
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,FieldCopyPropPhase);
  if ((bVar3) && (bVar3 = DoFunctionFieldCopyProp(this), bVar3)) {
    Output::Print(L"TRACE: CanDoFieldCopyProp Func: ");
    Func::DumpFullFunctionName(this->func);
    Output::Print(L"\n");
  }
  JsUtil::List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::List((List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)&localIntConstantToStackSymMap.stats,this->alloc,4);
  this->noImplicitCallUsesToInsert = (OpndList *)&localIntConstantToStackSymMap.stats;
  JsUtil::
  BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localIntConstantToValueMap.stats,this->alloc,0);
  this->intConstantToStackSymMap = (IntConstantToStackSymMap *)&localIntConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localInt64ConstantToValueMap.stats,this->alloc,0);
  this->intConstantToValueMap = (IntConstantToValueMap *)&localInt64ConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localAddrConstantToValueMap.stats,this->alloc,0);
  this->int64ConstantToValueMap = (Int64ConstantToValueMap *)&localAddrConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localStringConstantToValueMap.stats,this->alloc,0);
  this->addrConstantToValueMap = (AddrConstantToValueMap *)&localStringConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localPrePassInstrMap.stats,this->alloc,0);
  this->stringConstantToValueMap = (StringConstantToValueMap *)&localPrePassInstrMap.stats;
  JsUtil::
  BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localValuesCreatedForClone.
                       super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       .stats,this->alloc,0);
  this->prePassInstrMap =
       (SymIdToInstrMap *)
       &localValuesCreatedForClone.
        super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        .stats;
  JsUtil::
  BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)&localValuesCreatedForMerge.stats,this->alloc,0x40);
  this->valuesCreatedForClone = (ValueSetByValueNumber *)&localValuesCreatedForMerge.stats;
  JsUtil::
  BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localFinishedStackLiteralInitFld.lastUsedNodePrevNextField,this->alloc,0x40);
  this->valuesCreatedForMerge =
       (ValueNumberPairToValueMap *)&localFinishedStackLiteralInitFld.lastUsedNodePrevNextField;
  BVSparse<Memory::JitArenaAllocator>::BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)&blockNext,this->alloc);
  this->finishedStackLiteralInitFld = (BVSparse<Memory::JitArenaAllocator> *)&blockNext;
  pBVar1 = this->func->m_fg->blockList;
  while (_spilledCount = pBVar1, _spilledCount != (BasicBlock *)0x0) {
    pBVar1 = _spilledCount->next;
    if ((*(ushort *)&_spilledCount->field_0x18 & 1) == 0) {
      OptBlock(this,_spilledCount);
    }
  }
  uVar4 = Func::GetSourceContextId(this->func);
  uVar5 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,MemOpPhase,uVar4,uVar5);
  if (!bVar3) {
    ProcessMemOp(this);
  }
  this->noImplicitCallUsesToInsert = (OpndList *)0x0;
  this->intConstantToStackSymMap = (IntConstantToStackSymMap *)0x0;
  this->intConstantToValueMap = (IntConstantToValueMap *)0x0;
  this->int64ConstantToValueMap = (Int64ConstantToValueMap *)0x0;
  this->addrConstantToValueMap = (AddrConstantToValueMap *)0x0;
  this->stringConstantToValueMap = (StringConstantToValueMap *)0x0;
  this->finishedStackLiteralInitFld = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  block_1._4_4_ = 0;
  block_1._0_4_ = 0;
  for (local_3f0 = this->func->m_fg->blockList; local_3f0 != (BasicBlock *)0x0;
      local_3f0 = local_3f0->next) {
    if ((*(ushort *)&local_3f0->field_0x18 & 1) == 0) {
      uVar4 = BasicBlock::GetDataUseCount(local_3f0);
      if (uVar4 == 0) {
        block_1._4_4_ = block_1._4_4_ + 1;
      }
      else {
        block_1._0_4_ = (uint)block_1 + 1;
      }
      BasicBlock::SetDataUseCount(local_3f0,0);
      if (local_3f0->cloneStrCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                  (this->alloc,local_3f0->cloneStrCandidates);
        local_3f0->cloneStrCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      }
    }
  }
  if (block_1._4_4_ < (uint)block_1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1bb,"(freedCount >= spilledCount)","freedCount >= spilledCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  this->changedSymsAfterIncBailoutCandidate = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->auxSlotPtrSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_20,this->func,ForwardPhase,true,true);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)&blockNext);
  JsUtil::
  BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localFinishedStackLiteralInitFld.lastUsedNodePrevNextField);
  JsUtil::
  BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseHashSet((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)&localValuesCreatedForMerge.stats);
  JsUtil::
  BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localValuesCreatedForClone.
                        super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        .stats);
  JsUtil::
  BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localPrePassInstrMap.stats);
  JsUtil::
  BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localStringConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localAddrConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localInt64ConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localIntConstantToValueMap.stats);
  JsUtil::List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::~List((List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)&localIntConstantToStackSymMap.stats);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_20);
  return;
}

Assistant:

void
GlobOpt::ForwardPass()
{
    BEGIN_CODEGEN_PHASE(this->func, Js::ForwardPhase);

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::GlobOptPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        this->func->DumpHeader();
    }
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::GlobOptPhase))
    {
        this->TraceSettings();
    }
#endif

    // GetConstantCount() gives us the right size to pick for the SparseArray, but we may need more if we've inlined
    // functions with constants. There will be a gap in the symbol numbering between the main constants and
    // the inlined ones, so we'll most likely need a new array chunk. Make the min size of the array chunks be 64
    // in case we have a main function with very few constants and a bunch of constants from inlined functions.
    this->byteCodeConstantValueArray = SparseArray<Value>::New(this->alloc, max(this->func->GetJITFunctionBody()->GetConstCount(), 64U));
    this->byteCodeConstantValueNumbersBv = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->tempBv = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->prePassCopyPropSym = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->slotSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->byteCodeUses = nullptr;
    this->propertySymUse = nullptr;

    // changedSymsAfterIncBailoutCandidate helps track building incremental bailout in ForwardPass
    this->changedSymsAfterIncBailoutCandidate = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);

    this->auxSlotPtrSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);

#if DBG
    this->byteCodeUsesBeforeOpt = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldCopyPropPhase) && this->DoFunctionFieldCopyProp())
    {
        Output::Print(_u("TRACE: CanDoFieldCopyProp Func: "));
        this->func->DumpFullFunctionName();
        Output::Print(_u("\n"));
    }
#endif

    OpndList localNoImplicitCallUsesToInsert(alloc);
    this->noImplicitCallUsesToInsert = &localNoImplicitCallUsesToInsert;
    IntConstantToStackSymMap localIntConstantToStackSymMap(alloc);
    this->intConstantToStackSymMap = &localIntConstantToStackSymMap;
    IntConstantToValueMap localIntConstantToValueMap(alloc);
    this->intConstantToValueMap = &localIntConstantToValueMap;
    Int64ConstantToValueMap localInt64ConstantToValueMap(alloc);
    this->int64ConstantToValueMap = &localInt64ConstantToValueMap;
    AddrConstantToValueMap localAddrConstantToValueMap(alloc);
    this->addrConstantToValueMap = &localAddrConstantToValueMap;
    StringConstantToValueMap localStringConstantToValueMap(alloc);
    this->stringConstantToValueMap = &localStringConstantToValueMap;
    SymIdToInstrMap localPrePassInstrMap(alloc);
    this->prePassInstrMap = &localPrePassInstrMap;
    ValueSetByValueNumber localValuesCreatedForClone(alloc, 64);
    this->valuesCreatedForClone = &localValuesCreatedForClone;
    ValueNumberPairToValueMap localValuesCreatedForMerge(alloc, 64);
    this->valuesCreatedForMerge = &localValuesCreatedForMerge;

#if DBG
    BVSparse<JitArenaAllocator> localFinishedStackLiteralInitFld(alloc);
    this->finishedStackLiteralInitFld = &localFinishedStackLiteralInitFld;
#endif

    FOREACH_BLOCK_IN_FUNC_EDITING(block, this->func)
    {
        this->OptBlock(block);
    } NEXT_BLOCK_IN_FUNC_EDITING;

    if (!PHASE_OFF(Js::MemOpPhase, this->func))
    {
        ProcessMemOp();
    }

    this->noImplicitCallUsesToInsert = nullptr;
    this->intConstantToStackSymMap = nullptr;
    this->intConstantToValueMap = nullptr;
    this->int64ConstantToValueMap = nullptr;
    this->addrConstantToValueMap = nullptr;
    this->stringConstantToValueMap = nullptr;
#if DBG
    this->finishedStackLiteralInitFld = nullptr;
    uint freedCount = 0;
    uint spilledCount = 0;
#endif

    FOREACH_BLOCK_IN_FUNC(block, this->func)
    {
#if DBG
        if (block->GetDataUseCount() == 0)
        {
            freedCount++;
        }
        else
        {
            spilledCount++;
        }
#endif
        block->SetDataUseCount(0);
        if (block->cloneStrCandidates)
        {
            JitAdelete(this->alloc, block->cloneStrCandidates);
            block->cloneStrCandidates = nullptr;
        }
    } NEXT_BLOCK_IN_FUNC;

    // Make sure we free most of them.
    Assert(freedCount >= spilledCount);

    // this->alloc will be freed right after return, no need to free it here
    this->changedSymsAfterIncBailoutCandidate = nullptr;
    this->auxSlotPtrSyms = nullptr;

    END_CODEGEN_PHASE(this->func, Js::ForwardPhase);
}